

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O2

void __thiscall disruptor::test::BlockingStrategy::WaitForCursor::test_method(WaitForCursor *this)

{
  __atomic_base<long> local_c8;
  thread waiter;
  atomic<long> return_value;
  undefined **local_b0;
  undefined1 local_a8;
  undefined8 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  return_value.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  waiter._M_id._M_thread = (id)0;
  local_b0 = (undefined **)operator_new(0x18);
  *local_b0 = (undefined *)&PTR___State_00119ab8;
  local_b0[1] = (undefined *)this;
  local_b0[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter,&local_b0,0);
  if (local_b0 != (undefined **)0x0) {
    (**(code **)(*local_b0 + 8))();
  }
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x15e);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_00119cf8;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_58 = "";
  local_c8 = return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_b0,&local_60,0x15e,1,2,&local_c8,"return_value.load()",&kInitialCursorValue,
             "kInitialCursorValue");
  local_c8._M_i = 0;
  local_b0 = (undefined **)operator_new(0x10);
  *local_b0 = (undefined *)&PTR___State_00119af8;
  local_b0[1] = (undefined *)this;
  std::thread::_M_start_thread(&local_c8,&local_b0,0);
  if (local_b0 != (undefined **)0x0) {
    (**(code **)(*local_b0 + 8))();
  }
  std::thread::join();
  std::thread::~thread((thread *)&local_c8);
  std::thread::join();
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x164);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_00119cf8;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_88 = "";
  local_c8 = return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_b0,&local_90,0x164,1,2,&local_c8,"return_value.load()",&kFirstSequenceValue,
             "kFirstSequenceValue");
  std::thread::~thread(&waiter);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(
        strategy.WaitFor(kFirstSequenceValue, cursor, dependents, alerted));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() {
    cursor.IncrementAndGet(1L);
    strategy.SignalAllWhenBlocking();
  }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}